

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_uint16(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB,uint16_t *out)

{
  uint16_t *puVar1;
  uint16_t *endB;
  uint16_t *endA;
  uint16_t *initout;
  uint16_t *out_local;
  size_t lenB_local;
  uint16_t *B_local;
  size_t lenA_local;
  uint16_t *A_local;
  
  if ((lenA == 0) || (lenB == 0)) {
    return 0;
  }
  B_local = B;
  A_local = A;
  out_local = out;
  do {
    while (*A_local < *B_local) {
LAB_00107132:
      A_local = A_local + 1;
      if (A_local == A + lenA) {
        return (int32_t)((long)out_local - (long)out >> 1);
      }
    }
    while (*B_local < *A_local) {
      B_local = B_local + 1;
      if (B_local == B + lenB) {
        return (int32_t)((long)out_local - (long)out >> 1);
      }
    }
    if (*A_local != *B_local) goto LAB_00107132;
    puVar1 = out_local + 1;
    *out_local = *A_local;
    A_local = A_local + 1;
    if ((A_local == A + lenA) || (B_local = B_local + 1, out_local = puVar1, B_local == B + lenB)) {
      return (int32_t)((long)puVar1 - (long)out >> 1);
    }
  } while( true );
}

Assistant:

int32_t intersect_uint16(const uint16_t *A, const size_t lenA,
                         const uint16_t *B, const size_t lenB, uint16_t *out) {
    const uint16_t *initout = out;
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return (int32_t)(out - initout);
        }
        while (*A > *B) {
            if (++B == endB) return (int32_t)(out - initout);
        }
        if (*A == *B) {
            *out++ = *A;
            if (++A == endA || ++B == endB) return (int32_t)(out - initout);
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return (int32_t)(out - initout);  // NOTREACHED
}